

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O3

int ffparsecompspec(fitsfile *fptr,char *compspec,int *status)

{
  byte bVar1;
  ushort *puVar2;
  bool bVar3;
  double dVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ushort **ppuVar8;
  long lVar9;
  byte *pbVar10;
  byte bVar11;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar12;
  uint smooth;
  char *pcVar13;
  char *pcVar14;
  byte *pbVar15;
  float fVar16;
  long tilesize [6];
  byte *local_80;
  int local_78;
  undefined4 local_74;
  float local_70;
  float local_6c;
  long local_68 [7];
  
  local_68[4] = 0;
  local_68[5] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_68[0] = 0;
  local_68[1] = 0;
  pcVar14 = compspec + -1;
  do {
    pcVar13 = pcVar14;
    pcVar14 = pcVar13 + 1;
  } while (pcVar13[1] == ' ');
  iVar5 = strncmp(pcVar14,"compress",8);
  uVar12 = extraout_RDX;
  if ((iVar5 == 0) || (iVar5 = strncmp(pcVar14,"COMPRESS",8), uVar12 = extraout_RDX_00, iVar5 == 0))
  {
    pcVar13 = pcVar13 + 10;
    while( true ) {
      pcVar14 = pcVar13 + -1;
      bVar11 = pcVar13[-1];
      uVar7 = (ulong)bVar11;
      if (bVar11 != 0x20) break;
      pcVar13 = pcVar13 + 1;
    }
    if (bVar11 < 0x67) {
      if (0x4f < bVar11) {
        if (bVar11 != 0x50) {
          if (bVar11 == 0x52) goto LAB_00114db1;
          goto LAB_00114e32;
        }
LAB_00114d5e:
        pcVar13 = pcVar13 + -1;
        while ((0x3b < (byte)uVar7 || ((0x800000100000001U >> (uVar7 & 0x3f) & 1) == 0))) {
          pbVar15 = (byte *)(pcVar13 + 1);
          pcVar13 = pcVar13 + 1;
          uVar7 = (ulong)*pbVar15;
        }
        local_78 = 0x1f;
        goto LAB_00114e48;
      }
      if (bVar11 == 0x47) {
LAB_00114df5:
        pcVar13 = pcVar13 + -1;
        while ((0x3b < (byte)uVar7 || ((0x800000100000001U >> (uVar7 & 0x3f) & 1) == 0))) {
          pbVar15 = (byte *)(pcVar13 + 1);
          pcVar13 = pcVar13 + 1;
          uVar7 = (ulong)*pbVar15;
        }
        local_78 = 0x15;
        goto LAB_00114e48;
      }
      if (bVar11 != 0x48) goto LAB_00114e32;
LAB_00114d13:
      uVar7 = CONCAT71((int7)((ulong)uVar12 >> 8),*pcVar13);
      uVar6 = (int)uVar7 - 0x53;
      while ((0x3b < (byte)uVar7 || ((0x800000100000001U >> (uVar7 & 0x3f) & 1) == 0))) {
        pbVar15 = (byte *)(pcVar13 + 1);
        pcVar13 = pcVar13 + 1;
        uVar7 = (ulong)*pbVar15;
      }
      smooth = (uint)((uVar6 & 0xdf) == 0);
      local_78 = 0x29;
      local_74 = (undefined4)CONCAT71((uint7)(uint3)(uVar6 >> 8),1);
    }
    else {
      if (bVar11 < 0x70) {
        if (bVar11 == 0x67) goto LAB_00114df5;
        if (bVar11 == 0x68) goto LAB_00114d13;
      }
      else {
        if (bVar11 == 0x72) {
LAB_00114db1:
          while ((0x3b < (byte)uVar7 || ((0x800000100000001U >> (uVar7 & 0x3f) & 1) == 0))) {
            pbVar15 = (byte *)(pcVar14 + 1);
            pcVar14 = pcVar14 + 1;
            uVar7 = (ulong)*pbVar15;
          }
          local_78 = 0xb;
          pcVar13 = pcVar14;
          goto LAB_00114e48;
        }
        if (bVar11 == 0x70) goto LAB_00114d5e;
      }
LAB_00114e32:
      local_78 = 0xb;
      pcVar13 = pcVar13 + -1;
LAB_00114e48:
      local_74 = 0;
      smooth = 0;
    }
    pbVar15 = (byte *)(pcVar13 + -1);
    do {
      pbVar10 = pbVar15 + 1;
      pbVar15 = pbVar15 + 1;
    } while (*pbVar10 == 0x20);
    local_80 = pbVar15;
    ppuVar8 = __ctype_b_loc();
    puVar2 = *ppuVar8;
    bVar11 = *pbVar15;
    if ((*(byte *)((long)puVar2 + (long)(char)bVar11 * 2 + 1) & 8) != 0) {
      uVar7 = 0;
      do {
        lVar9 = atol((char *)pbVar15);
        local_68[uVar7] = lVar9;
        pbVar15 = pbVar15 + -1;
        do {
          pbVar10 = pbVar15;
          bVar1 = pbVar10[1];
          pbVar15 = pbVar10 + 1;
        } while ((*(byte *)((long)puVar2 + (long)(char)bVar1 * 2 + 1) & 8) != 0);
        do {
          bVar11 = pbVar10[(ulong)(bVar1 == 0x2c) + 1];
          pbVar10 = pbVar10 + 1;
        } while ((long)(char)bVar11 == 0x20);
        if ((*(byte *)((long)puVar2 + (long)(char)bVar11 * 2 + 1) & 8) == 0) break;
        pbVar15 = pbVar10 + (bVar1 == 0x2c);
        bVar3 = uVar7 < 8;
        uVar7 = uVar7 + 1;
      } while (bVar3);
      pbVar15 = pbVar10 + (bVar1 == 0x2c);
    }
    if (bVar11 == 0x3b) {
      do {
        local_80 = pbVar15 + 1;
        bVar11 = *local_80;
        pbVar15 = local_80;
      } while (bVar11 == 0x20);
      local_6c = 0.0;
      fVar16 = -99.0;
      iVar5 = 1;
LAB_00114f11:
      if (0x70 < bVar11) {
        if (bVar11 == 0x71) goto LAB_00114f81;
        if (bVar11 != 0x73) goto LAB_00114cb1;
LAB_00114f3c:
        do {
          pbVar15 = local_80 + 1;
          local_80 = local_80 + 1;
        } while (*pbVar15 == 0x20);
        local_70 = fVar16;
        dVar4 = strtod((char *)local_80,(char **)&local_80);
        for (; (*local_80 == 0x2c || (*local_80 == 0x20)); local_80 = local_80 + 1) {
        }
        local_6c = (float)dVar4;
        fVar16 = local_70;
LAB_00114ff7:
        bVar11 = *local_80;
        goto LAB_00114f11;
      }
      if (bVar11 == 0x51) {
LAB_00114f81:
        pbVar15 = local_80 + 1;
        bVar11 = local_80[1];
        if (bVar11 == 0x30) {
          iVar5 = -1;
LAB_00114fbe:
          pbVar15 = local_80 + 2;
        }
        else if ((bVar11 == 0x7a) || (bVar11 == 0x5a)) {
          iVar5 = 2;
          goto LAB_00114fbe;
        }
        local_80 = pbVar15 + -1;
        do {
          pbVar15 = local_80 + 1;
          local_80 = local_80 + 1;
        } while (*pbVar15 == 0x20);
        dVar4 = strtod((char *)local_80,(char **)&local_80);
        for (; (*local_80 == 0x2c || (*local_80 == 0x20)); local_80 = local_80 + 1) {
        }
        fVar16 = (float)dVar4;
        goto LAB_00114ff7;
      }
      if (bVar11 == 0x53) goto LAB_00114f3c;
      local_70 = fVar16;
      if (bVar11 != 0) goto LAB_00114cb1;
    }
    else {
      local_6c = 0.0;
      local_70 = -99.0;
      iVar5 = 1;
    }
    fits_set_compression_type(fptr,local_78,status);
    fits_set_tile_dim(fptr,6,local_68,status);
    if ((char)local_74 != '\0') {
      fits_set_hcomp_scale(fptr,local_6c,status);
      fits_set_hcomp_smooth(fptr,smooth,status);
    }
    if ((local_70 != -99.0) || (NAN(local_70))) {
      fits_set_quantize_level(fptr,local_70,status);
      fits_set_quantize_method(fptr,iVar5,status);
    }
    iVar5 = *status;
  }
  else {
LAB_00114cb1:
    *status = 0x7d;
    iVar5 = 0x7d;
  }
  return iVar5;
}

Assistant:

int ffparsecompspec(fitsfile *fptr,  /* I - FITS file pointer               */
           char *compspec,     /* I - image compression specification */
           int *status)          /* IO - error status                       */
/*
  Parse the image compression specification that was give in square brackets
  following the output FITS file name, as in these examples:

    myfile.fits[compress]  - default Rice compression, row by row 
    myfile.fits[compress TYPE] -  the first letter of TYPE defines the
                                  compression algorithm:
                                   R = Rice
                                   G = GZIP
                                   H = HCOMPRESS
                                   HS = HCOMPRESS (with smoothing)
				   B - BZIP2
                                   P = PLIO

    myfile.fits[compress TYPE 100,100] - the numbers give the dimensions
                                         of the compression tiles.  Default
                                         is NAXIS1, 1, 1, ...

       other optional parameters may be specified following a semi-colon 
       
    myfile.fits[compress; q 8.0]          q specifies the floating point 
    mufile.fits[compress TYPE; q -.0002]        quantization level;
    myfile.fits[compress TYPE 100,100; q 10, s 25]  s specifies the HCOMPRESS
                                                     integer scaling parameter

The compression parameters are saved in the fptr->Fptr structure for use
when writing FITS images.

*/
{
    char *ptr1;

    /* initialize with default values */
    int ii, compresstype = RICE_1, smooth = 0;
    int quantize_method = SUBTRACTIVE_DITHER_1;
    long tilesize[MAX_COMPRESS_DIM] = {0,0,0,0,0,0};
    float qlevel = -99., scale = 0.;
    
    ptr1 = compspec;
    while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;

    if (strncmp(ptr1, "compress", 8) && strncmp(ptr1, "COMPRESS", 8) )
    {
       /* apparently this string does not specify compression parameters */
       return(*status = URL_PARSE_ERROR);
    }

    ptr1 += 8;
    while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;

    /* ========================= */
    /* look for compression type */
    /* ========================= */

    if (*ptr1 == 'r' || *ptr1 == 'R')
    {
        compresstype = RICE_1;
        while (*ptr1 != ' ' && *ptr1 != ';' && *ptr1 != '\0') 
           ptr1++;
    }
    else if (*ptr1 == 'g' || *ptr1 == 'G')
    {
        compresstype = GZIP_1;
        while (*ptr1 != ' ' && *ptr1 != ';' && *ptr1 != '\0') 
           ptr1++;

    }
/*
    else if (*ptr1 == 'b' || *ptr1 == 'B')
    {
        compresstype = BZIP2_1;
        while (*ptr1 != ' ' && *ptr1 != ';' && *ptr1 != '\0') 
           ptr1++;

    }
*/
    else if (*ptr1 == 'p' || *ptr1 == 'P')
    {
        compresstype = PLIO_1;
        while (*ptr1 != ' ' && *ptr1 != ';' && *ptr1 != '\0') 
           ptr1++;
    }
    else if (*ptr1 == 'h' || *ptr1 == 'H')
    {
        compresstype = HCOMPRESS_1;
        ptr1++;
        if (*ptr1 == 's' || *ptr1 == 'S')
           smooth = 1;  /* apply smoothing when uncompressing HCOMPRESSed image */

        while (*ptr1 != ' ' && *ptr1 != ';' && *ptr1 != '\0') 
           ptr1++;
    }

    /* ======================== */
    /* look for tile dimensions */
    /* ======================== */

    while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;

    ii = 0;
    while (isdigit( (int) *ptr1) && ii < 9)
    {
       tilesize[ii] = atol(ptr1);  /* read the integer value */
       ii++;

       while (isdigit((int) *ptr1))    /* skip over the integer */
           ptr1++;

       if (*ptr1 == ',')
           ptr1++;   /* skip over the comma */
          
       while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;
    }

    /* ========================================================= */
    /* look for semi-colon, followed by other optional parameters */
    /* ========================================================= */

    if (*ptr1 == ';') {
        ptr1++;
        while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;

          while (*ptr1 != 0) {  /* haven't reached end of string yet */

              if (*ptr1 == 's' || *ptr1 == 'S') {
                  /* this should be the HCOMPRESS "scale" parameter; default = 1 */
	   
                  ptr1++;
                  while (*ptr1 == ' ')    /* ignore leading blanks */
                      ptr1++;

                  scale = (float) strtod(ptr1, &ptr1);

                  while (*ptr1 == ' ' || *ptr1 == ',') /* skip over blanks or comma */
                     ptr1++;

            } else if (*ptr1 == 'q' || *ptr1 == 'Q') {
                /* this should be the floating point quantization parameter */

                  ptr1++;
                  if (*ptr1 == 'z' || *ptr1 == 'Z') {
                      /* use the subtractive_dither_2 option */
                      quantize_method = SUBTRACTIVE_DITHER_2;
                      ptr1++;
		  } else if (*ptr1 == '0') {
                      /* do not dither */
                      quantize_method = NO_DITHER;
                      ptr1++;
		  }

                  while (*ptr1 == ' ')    /* ignore leading blanks */
                      ptr1++;

                  qlevel = (float) strtod(ptr1, &ptr1);

                  while (*ptr1 == ' ' || *ptr1 == ',') /* skip over blanks or comma */
                     ptr1++;

            } else {
                return(*status = URL_PARSE_ERROR);
            }
        }
    }

    /* ================================= */
    /* finished parsing; save the values */
    /* ================================= */

    fits_set_compression_type(fptr, compresstype, status);
    fits_set_tile_dim(fptr, MAX_COMPRESS_DIM, tilesize, status);
 
    if (compresstype == HCOMPRESS_1) {
        fits_set_hcomp_scale (fptr, scale,  status);
        fits_set_hcomp_smooth(fptr, smooth, status);
    }

    if (qlevel != -99.) {
        fits_set_quantize_level(fptr, qlevel, status);
        fits_set_quantize_method(fptr, quantize_method, status);
    }

    return(*status);
}